

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O2

void __thiscall xray_re::xr_ibuf::load(xr_ibuf *this,xr_reader *r,size_t n)

{
  unsigned_short *values;
  ulong uVar1;
  
  if ((n != 0) && (n % 3 == 0)) {
    clear(this);
    uVar1 = 0xffffffffffffffff;
    if (-1 < (long)n) {
      uVar1 = n * 2;
    }
    values = (unsigned_short *)operator_new__(uVar1);
    this->m_indices = values;
    xr_reader::r_cseq<unsigned_short>(r,n,values);
    (this->super_xr_flexbuf).m_size = n;
    return;
  }
  __assert_fail("n && (n%3 == 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0x1d1,"void xray_re::xr_ibuf::load(xr_reader &, size_t)");
}

Assistant:

void xr_ibuf::load(xr_reader& r, size_t n)
{
	xr_assert(n && (n%3 == 0));
	clear();
	m_indices = new uint16_t[n];
	r.r_cseq(n, m_indices);
	set_size(n);
}